

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O2

xor_hashes_t * xor8_get_h0_h1_h2(xor_hashes_t *__return_storage_ptr__,uint64_t k,xor8_t *filter)

{
  uint64_t uVar1;
  ulong uVar2;
  
  uVar1 = xor_mix_split(k,filter->seed);
  __return_storage_ptr__->h = uVar1;
  uVar2 = (ulong)(uint)filter->blockLength;
  __return_storage_ptr__->h0 = (uint32_t)((uVar1 & 0xffffffff) * uVar2 >> 0x20);
  __return_storage_ptr__->h1 =
       (uint32_t)(((uint)(uVar1 << 0x15) | (uint)(uVar1 >> 0x2b)) * uVar2 >> 0x20);
  __return_storage_ptr__->h2 = (uint32_t)((uVar1 >> 0x16 & 0xffffffff) * uVar2 >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

static inline xor_hashes_t xor8_get_h0_h1_h2(uint64_t k, const xor8_t *filter) {
  uint64_t hash = xor_mix_split(k, filter->seed);
  xor_hashes_t answer;
  answer.h = hash;
  uint32_t r0 = (uint32_t)hash;
  uint32_t r1 = (uint32_t)xor_rotl64(hash, 21);
  uint32_t r2 = (uint32_t)xor_rotl64(hash, 42);

  answer.h0 = xor_reduce(r0, (uint32_t)filter->blockLength);
  answer.h1 = xor_reduce(r1, (uint32_t)filter->blockLength);
  answer.h2 = xor_reduce(r2, (uint32_t)filter->blockLength);
  return answer;
}